

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_buffer.hpp
# Opt level: O0

unsigned_long __thiscall duckdb::ByteBuffer::read<unsigned_long>(ByteBuffer *this)

{
  unsigned_long uVar1;
  ByteBuffer *in_RDI;
  ByteBuffer *unaff_retaddr;
  
  available(unaff_retaddr,(uint64_t)in_RDI);
  uVar1 = unsafe_read<unsigned_long>(in_RDI);
  return uVar1;
}

Assistant:

T read() {
		available(sizeof(T));
		return unsafe_read<T>();
	}